

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIso.c
# Opt level: O2

Aig_Man_t * Saig_ManDupIsoCanonical(Aig_Man_t *pAig,int fVerbose)

{
  char *__s;
  int iVar1;
  Vec_Int_t *vPermCis;
  Vec_Int_t *p;
  Aig_Man_t *p_00;
  size_t sVar2;
  char *__dest;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  int iVar5;
  Vec_Int_t *vPermCo;
  Vec_Int_t *vPerm;
  Vec_Int_t *local_40;
  Vec_Int_t *local_38;
  
  vPermCis = Saig_ManFindIsoPerm(pAig,fVerbose);
  local_38 = vPermCis;
  p = Saig_ManFindIsoPermCos(pAig,vPermCis);
  local_40 = p;
  p_00 = Aig_ManStart(pAig->nObjs[6] + pAig->nObjs[5]);
  __s = pAig->pName;
  iVar5 = 0;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar2 = strlen(__s);
    __dest = (char *)malloc(sVar2 + 1);
    strcpy(__dest,__s);
  }
  p_00->pName = __dest;
  Aig_ManIncrementTravId(pAig);
  pAVar3 = pAig->pConst1;
  pAVar3->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  pAVar3->TravId = pAig->nTravIds;
  for (; iVar5 < vPermCis->nSize; iVar5 = iVar5 + 1) {
    iVar1 = Vec_IntEntry(vPermCis,iVar5);
    pAVar3 = Aig_ManCi(pAig,iVar1);
    pAVar4 = Aig_ObjCreateCi(p_00);
    (pAVar3->field_5).pData = pAVar4;
    pAVar3->TravId = pAig->nTravIds;
  }
  for (iVar5 = 0; iVar1 = p->nSize, iVar5 < iVar1; iVar5 = iVar5 + 1) {
    iVar1 = Vec_IntEntry(p,iVar5);
    pAVar3 = Aig_ManCo(pAig,iVar1);
    Saig_ManDupIsoCanonical_rec
              (p_00,pAig,(Aig_Obj_t *)((ulong)pAVar3->pFanin0 & 0xfffffffffffffffe));
  }
  for (iVar5 = 0; iVar5 < iVar1; iVar5 = iVar5 + 1) {
    iVar1 = Vec_IntEntry(p,iVar5);
    pAVar3 = Aig_ManCo(pAig,iVar1);
    pAVar3 = Aig_ObjChild0Copy(pAVar3);
    Aig_ObjCreateCo(p_00,pAVar3);
    iVar1 = p->nSize;
  }
  Aig_ManSetRegNum(p_00,pAig->nRegs);
  Vec_IntFreeP(&local_38);
  Vec_IntFreeP(&local_40);
  return p_00;
}

Assistant:

Aig_Man_t * Saig_ManDupIsoCanonical( Aig_Man_t * pAig, int fVerbose )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    Vec_Int_t * vPerm, * vPermCo;
    int i, Entry;
    // derive permutations
    vPerm   = Saig_ManFindIsoPerm( pAig, fVerbose );
    vPermCo = Saig_ManFindIsoPermCos( pAig, vPerm );
    // create the new manager
    pNew = Aig_ManStart( Aig_ManNodeNum(pAig) );
    pNew->pName = Abc_UtilStrsav( pAig->pName );
    Aig_ManIncrementTravId( pAig );
    // create constant
    pObj = Aig_ManConst1(pAig);
    pObj->pData = Aig_ManConst1(pNew);
    Aig_ObjSetTravIdCurrent( pAig, pObj );
    // create PIs
    Vec_IntForEachEntry( vPerm, Entry, i )
    {
        pObj = Aig_ManCi(pAig, Entry);
        pObj->pData = Aig_ObjCreateCi(pNew);
        Aig_ObjSetTravIdCurrent( pAig, pObj );
    }
    // traverse from the POs
    Vec_IntForEachEntry( vPermCo, Entry, i )
    {
        pObj = Aig_ManCo(pAig, Entry);
        Saig_ManDupIsoCanonical_rec( pNew, pAig, Aig_ObjFanin0(pObj) );
    }
    // create POs
    Vec_IntForEachEntry( vPermCo, Entry, i )
    {
        pObj = Aig_ManCo(pAig, Entry);
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    }
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(pAig) );
    Vec_IntFreeP( &vPerm );
    Vec_IntFreeP( &vPermCo );
    return pNew;
}